

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O2

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::calcDeadReckoningFPB
          (DeadReckoningCalculator *this,WorldCoordinates *PositionOut,KFLOAT32 totalTimeSinceReset)

{
  float fVar1;
  float fVar2;
  double __x;
  double dVar3;
  double dVar4;
  double dVar5;
  Vector *this_00;
  TMATRIX IMatrix;
  TMATRIX R1;
  Vector local_d8;
  undefined1 local_c0 [16];
  KFLOAT64 KStack_b0;
  KFLOAT64 local_a8;
  Vector local_98;
  Vector local_70;
  WorldCoordinates local_58;
  float local_38;
  
  fVar1 = (float)this->m_f64Magnitude;
  __x = (double)(fVar1 * (float)totalTimeSinceReset);
  if (__x <= 1e-05) {
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
              ((Vector *)local_c0,&this->m_initOrientationMatrixTranspose,
               &this->m_initLinearVelocity);
    DATA_TYPE::Vector::operator*(&local_98,(Vector *)local_c0,totalTimeSinceReset);
    DATA_TYPE::WorldCoordinates::operator+(&local_58,&this->m_initPosition,&local_98);
    PositionOut->m_f64Z = local_58.m_f64Z;
    PositionOut->m_f64X = local_58.m_f64X;
    PositionOut->m_f64Y = local_58.m_f64Y;
    DATA_TYPE::DataTypeBase::~DataTypeBase(&local_58.super_DataTypeBase);
    DATA_TYPE::DataTypeBase::~DataTypeBase(&local_98.super_DataTypeBase);
    this_00 = (Vector *)local_c0;
  }
  else {
    dVar3 = sin(__x);
    dVar4 = sin(__x);
    fVar2 = (float)this->m_f64Magnitude;
    dVar5 = cos(__x);
    local_38 = (this->m_wwMatrix).Data[2][2];
    local_58.super_DataTypeBase._vptr_DataTypeBase = *(_func_int ***)(this->m_wwMatrix).Data[0];
    local_58.m_f64X = *(KFLOAT64 *)((this->m_wwMatrix).Data[0] + 2);
    local_58.m_f64Y = *(KFLOAT64 *)((this->m_wwMatrix).Data[1] + 1);
    local_58.m_f64Z = *(KFLOAT64 *)(this->m_wwMatrix).Data[2];
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::Matrix
              ((Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)&local_98);
    Matrix<float,(unsigned_char)3,(unsigned_char)3>::operator*=
              ((Matrix<float,(unsigned_char)3,(unsigned_char)3> *)&local_58,
               (__x - dVar3) / (double)(fVar1 * fVar1 * fVar1));
    Matrix<float,(unsigned_char)3,(unsigned_char)3>::operator*=
              ((Matrix<float,(unsigned_char)3,(unsigned_char)3> *)&local_98,dVar4 / (double)fVar2);
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator+=
              ((Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)&local_58,
               (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)&local_98);
    Matrix<float,(unsigned_char)3,(unsigned_char)3>::operator*
              ((Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)local_c0,
               (Matrix<float,(unsigned_char)3,(unsigned_char)3> *)&this->m_SkewOmegaMatrix,
               (1.0 - dVar5) / (double)(fVar1 * fVar1));
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator+=
              ((Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)&local_58,
               (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)local_c0);
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
              (&local_70,(Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)&local_58,
               &this->m_initLinearVelocity);
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
              (&local_d8,&this->m_initOrientationMatrixTranspose,&local_70);
    DATA_TYPE::WorldCoordinates::operator+
              ((WorldCoordinates *)local_c0,&this->m_initPosition,&local_d8);
    PositionOut->m_f64Z = local_a8;
    PositionOut->m_f64X = (KFLOAT64)local_c0._8_8_;
    PositionOut->m_f64Y = KStack_b0;
    DATA_TYPE::DataTypeBase::~DataTypeBase((DataTypeBase *)local_c0);
    DATA_TYPE::DataTypeBase::~DataTypeBase(&local_d8.super_DataTypeBase);
    this_00 = &local_70;
  }
  DATA_TYPE::DataTypeBase::~DataTypeBase(&this_00->super_DataTypeBase);
  return;
}

Assistant:

void DeadReckoningCalculator::calcDeadReckoningFPB( WorldCoordinates & PositionOut, const KFLOAT32 totalTimeSinceReset )
{
    // See page 124 of IEEE 1278.1 - 1995 for more details on this and other dead reckoning equations.

    // Calculate Magnitude, scalars etc
    const KFLOAT64 f64DeltaMag = totalTimeSinceReset * m_f64Magnitude;
    if( f64DeltaMag > MAGIC_EPSILON )
    {
        KFLOAT32 m_f32MagPow2 = m_f64Magnitude * m_f64Magnitude;
        KFLOAT32 m_f32MagPow3 = m_f32MagPow2 * m_f64Magnitude;

        const KFLOAT64 f64Scalar = ( ( f64DeltaMag ) - sin( f64DeltaMag ) ) / m_f32MagPow3;
        const KFLOAT64 f64IScalar = sin( f64DeltaMag ) / m_f64Magnitude;
        const KFLOAT64 f64SkewScale = ( 1 - cos( f64DeltaMag ) ) / m_f32MagPow2 ;
        TMATRIX R1( m_wwMatrix ), IMatrix;
        R1 *= f64Scalar;
        IMatrix *= f64IScalar;
        R1 += IMatrix;
        R1 += ( m_SkewOmegaMatrix * f64SkewScale ); // RI - should be + instead of - IEEE 1278.1-1995.pdf page 128

        PositionOut = ( m_initPosition + ( m_initOrientationMatrixTranspose * ( R1 * m_initLinearVelocity ) ) );
    }
    else
    {
        PositionOut = ( m_initPosition + ( m_initOrientationMatrixTranspose * m_initLinearVelocity * totalTimeSinceReset ) );
    }
}